

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data;
  conncache *h;
  size_t sVar1;
  long lVar2;
  connectbundle *bundle;
  size_t key_len;
  void *pvVar3;
  char **in_RCX;
  CURLcode CVar4;
  char key [128];
  
  data = conn->data;
  CVar4 = CURLE_OK;
  bundle = Curl_conncache_find_bundle(conn,(data->state).conn_cache,(char **)0x0);
  if (bundle == (connectbundle *)0x0) {
    bundle = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (bundle != (connectbundle *)0x0) {
      bundle->num_connections = 0;
      bundle->multiuse = 0;
      Curl_llist_init(&bundle->conn_list,conn_llist_dtor);
      hashkey(conn,key,0,in_RCX);
      h = (data->state).conn_cache;
      key_len = strlen(key);
      pvVar3 = Curl_hash_add(&h->hash,key,key_len,bundle);
      if (pvVar3 != (void *)0x0) goto LAB_0010d22c;
      bundle_destroy(bundle);
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_0010d22c:
    Curl_llist_insert_next(&bundle->conn_list,(bundle->conn_list).tail,conn,&conn->bundle_node);
    conn->bundle = bundle;
    bundle->num_connections = bundle->num_connections + 1;
    sVar1 = connc->num_conn;
    lVar2 = connc->next_connection_id;
    conn->connection_id = lVar2;
    connc->num_conn = sVar1 + 1;
    connc->next_connection_id = lVar2 + 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache, NULL);
  if(!bundle) {
    int rc;
    char key[HASHKEY_SIZE];

    result = bundle_create(&bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key), NULL);
    rc = conncache_add_bundle(data->state.conn_cache, key, bundle);

    if(!rc) {
      bundle_destroy(bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %zu members\n",
               conn->connection_id, connc->num_conn));

  unlock:
  CONNCACHE_UNLOCK(data);

  return result;
}